

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int record_receipt(st_quicly_pn_space_t *space,uint64_t pn,int is_ack_only,int64_t now,
                  int64_t *send_ack_at)

{
  int iVar1;
  quicly_range_t *in_RCX;
  int in_EDX;
  long in_RSI;
  long *in_RDI;
  quicly_ranges_t *in_R8;
  bool bVar2;
  int is_out_of_order;
  int ack_now;
  int ret;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  iVar1 = record_pn(in_R8,CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                    (int *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if (iVar1 == 0) {
    bVar2 = false;
    if ((in_stack_ffffffffffffffcc != 0) && (bVar2 = false, (char)in_RDI[8] == '\0')) {
      bVar2 = in_EDX == 0;
    }
    if (*(long *)(*in_RDI + (in_RDI[1] + -1) * 0x10 + 8) == in_RSI + 1) {
      in_RDI[5] = (long)in_RCX;
    }
    if ((in_EDX == 0) &&
       (*(int *)(in_RDI + 7) = (int)in_RDI[7] + 1,
       *(uint *)((long)in_RDI + 0x3c) <= *(uint *)(in_RDI + 7))) {
      bVar2 = true;
    }
    if (bVar2) {
      in_R8->ranges = in_RCX;
    }
    else if ((in_R8->ranges == (quicly_range_t *)0x7fffffffffffffff) && ((int)in_RDI[7] != 0)) {
      in_R8->ranges = (quicly_range_t *)((long)&in_RCX[1].end + 1);
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int record_receipt(struct st_quicly_pn_space_t *space, uint64_t pn, int is_ack_only, int64_t now, int64_t *send_ack_at)
{
    int ret, ack_now, is_out_of_order;

    if ((ret = record_pn(&space->ack_queue, pn, &is_out_of_order)) != 0)
        goto Exit;

    ack_now = is_out_of_order && !space->ignore_order && !is_ack_only;

    /* update largest_pn_received_at (TODO implement deduplication at an earlier moment?) */
    if (space->ack_queue.ranges[space->ack_queue.num_ranges - 1].end == pn + 1)
        space->largest_pn_received_at = now;

    /* if the received packet is ack-eliciting, update / schedule transmission of ACK */
    if (!is_ack_only) {
        space->unacked_count++;
        if (space->unacked_count >= space->packet_tolerance)
            ack_now = 1;
    }

    if (ack_now) {
        *send_ack_at = now;
    } else if (*send_ack_at == INT64_MAX && space->unacked_count != 0) {
        *send_ack_at = now + QUICLY_DELAYED_ACK_TIMEOUT;
    }

    ret = 0;
Exit:
    return ret;
}